

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O3

chunk_conflict * desert_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int iVar1;
  int iVar2;
  short sVar3;
  short sVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  wchar_t wVar10;
  chunk *c;
  ulong uVar11;
  feature *pfVar12;
  wchar_t *pwVar13;
  loc lVar14;
  loc_conflict lVar15;
  int iVar16;
  wchar_t wVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int local_8c;
  long local_88;
  ulong local_80;
  int local_78;
  loc_conflict local_60;
  wchar_t form_feats [7];
  
  wVar17 = (wchar_t)p->place;
  sVar3 = p->last_place;
  sVar4 = p->depth;
  form_feats[0] = FEAT_GRASS;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_DUNE;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  local_60 = loc(0,0);
  local_80 = (ulong)local_60 >> 0x20;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar17;
  wVar10 = c->height;
  if (L'\0' < wVar10) {
    uVar11 = (ulong)(uint)c->width;
    lVar22 = 0;
    lVar24 = 0;
    do {
      if (0 < (int)uVar11) {
        lVar19 = 0;
        do {
          square_set_feat((chunk_conflict *)c,(loc)(lVar22 + lVar19),FEAT_GRASS);
          lVar19 = lVar19 + 1;
          uVar11 = (ulong)c->width;
        } while (lVar19 < (long)uVar11);
        wVar10 = c->height;
      }
      lVar24 = lVar24 + 1;
      lVar22 = lVar22 + 0x100000000;
    } while (lVar24 < wVar10);
  }
  local_8c = sVar4 * 0x14;
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar17,(int)sVar3,wVar10);
  set_num_vaults((chunk_conflict *)c);
  uVar11 = 0;
  make_edges((chunk_conflict *)c,true,false);
  if (world->levels[wVar17].down == (char *)0x0) {
    wVar10 = c->height;
  }
  else {
    num_wild_vaults = L'\0';
    wVar17 = c->width;
    uVar20 = local_80;
    if (L'\0' < wVar17) {
      local_88 = 0;
      uVar11 = 0;
      do {
        uVar20 = local_80;
        if (uVar11 != 0) {
          uVar23 = uVar11 & 0xffffffff;
          lVar22 = 0;
          lVar24 = 0;
          do {
            lVar14 = (loc)(lVar22 + uVar23);
            _Var5 = square_in_bounds_fully((chunk_conflict *)c,lVar14);
            if (_Var5) {
              pfVar12 = square_feat((chunk_conflict *)c,lVar14);
              if (pfVar12->fidx == FEAT_ROAD) {
                local_60 = (loc_conflict)(lVar24 - local_88);
                square_set_feat((chunk_conflict *)c,(loc)(lVar22 + uVar23),FEAT_MORE);
                wVar10 = level_topography((int)sVar3);
                uVar20 = -lVar24;
                if ((wVar10 == L'\a') || (turn < 10)) {
                  player_place((chunk_conflict2 *)c,p,(loc_conflict)(lVar22 + uVar23));
                }
                break;
              }
              square_set_feat((chunk_conflict *)c,lVar14,FEAT_GRANITE);
            }
            lVar24 = lVar24 + -1;
            lVar22 = lVar22 + 0x100000000;
            uVar23 = (ulong)((int)uVar23 - 1);
          } while (local_88 != lVar24);
        }
        wVar17 = c->width;
        if ((int)uVar20 != 0) break;
        uVar11 = uVar11 + 1;
        local_88 = local_88 + -1;
        local_80 = 0;
      } while ((long)uVar11 < (long)wVar17);
    }
    wVar10 = c->height;
    local_8c = ((wVar17 * wVar10 - ((uint)((int)uVar11 * (int)uVar11) >> 1)) * local_8c) /
               (wVar17 * wVar10);
    local_80 = uVar20;
  }
  if (L'\0' < wVar10) {
    uVar11 = (ulong)(uint)c->width;
    lVar24 = 0;
    lVar22 = 0;
    do {
      if (0 < (int)uVar11) {
        lVar19 = 0;
        do {
          lVar14 = (loc)(lVar24 + lVar19);
          pfVar12 = square_feat((chunk_conflict *)c,lVar14);
          if (pfVar12->fidx == FEAT_GRASS) {
            uVar6 = Rand_div(2);
            if (uVar6 == 0) {
              pwVar13 = &FEAT_DUNE;
LAB_0015dce4:
              wVar10 = *pwVar13;
            }
            else {
              uVar6 = Rand_div(2);
              wVar10 = FEAT_MAGMA;
              if (uVar6 == 0) {
                pwVar13 = &FEAT_PASS_RUBBLE;
                goto LAB_0015dce4;
              }
            }
            square_set_feat((chunk_conflict *)c,lVar14,wVar10);
          }
          else {
            square_mark((chunk_conflict *)c,lVar14);
          }
          lVar19 = lVar19 + 1;
          uVar11 = (ulong)c->width;
        } while (lVar19 < (long)uVar11);
        wVar10 = c->height;
      }
      lVar22 = lVar22 + 1;
      lVar24 = lVar24 + 0x100000000;
    } while (lVar22 < wVar10);
  }
  local_78 = rand_range(2,4);
  iVar18 = 0x32;
  do {
    uVar6 = Rand_div(6);
    iVar1 = uVar6 + 4;
    uVar7 = Rand_div(5);
    iVar2 = uVar7 + 4;
    iVar9 = 7;
    if (7 < iVar2) {
      iVar9 = iVar2;
    }
    iVar16 = (c->height - uVar7) + -5;
    iVar21 = c->height + L'\xfffffff8';
    if (iVar16 < iVar21) {
      iVar21 = iVar16;
    }
    iVar21 = rand_range(iVar9,iVar21);
    iVar9 = 10;
    if (10 < iVar1) {
      iVar9 = iVar1;
    }
    iVar8 = (c->width - uVar6) + -5;
    iVar16 = c->height + L'\xfffffff5';
    if (iVar8 < iVar16) {
      iVar16 = iVar8;
    }
    iVar9 = rand_range(iVar9,iVar16);
    lVar14 = (loc)loc(iVar9,iVar21);
    _Var5 = square_isgranite((chunk_conflict *)c,lVar14);
    if (!_Var5) {
      lVar15 = loc(iVar9,iVar21);
      wVar10 = distance(lVar15,(loc_conflict)((ulong)local_60 & 0xffffffff | local_80 << 0x20));
      if (iVar2 + iVar1 <= wVar10) {
        _Var5 = generate_starburst_room
                          (c,iVar21 - iVar2,iVar9 - iVar1,iVar21 + iVar2,iVar9 + iVar1,false,
                           FEAT_GRASS,false);
        local_78 = local_78 - (uint)_Var5;
        if (local_78 == 0) break;
      }
    }
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
  if (0 < local_8c) {
    iVar18 = 0;
    do {
      uVar6 = Rand_div(c->height + L'\xfffffffe');
      uVar7 = Rand_div(c->width + L'\xfffffffe');
      lVar15.y = uVar6 + 1;
      lVar15.x = uVar7 + 1;
      wVar10 = make_formation((chunk_conflict *)c,p,lVar15,FEAT_RUBBLE,FEAT_MAGMA,form_feats,
                              "Desert",c->depth);
      iVar18 = iVar18 + wVar10;
    } while (iVar18 < local_8c);
  }
  wVar10 = c->height;
  if (L'\0' < wVar10) {
    uVar11 = (ulong)(uint)c->width;
    lVar22 = 0;
    lVar24 = 0;
    do {
      if (0 < (int)uVar11) {
        lVar19 = 0;
        do {
          square_unmark((chunk_conflict *)c,(loc)(lVar22 + lVar19));
          lVar19 = lVar19 + 1;
          uVar11 = (ulong)c->width;
        } while (lVar19 < (long)uVar11);
        wVar10 = c->height;
      }
      lVar24 = lVar24 + 1;
      lVar22 = lVar22 + 0x100000000;
    } while (lVar24 < wVar10);
  }
  populate((chunk_conflict *)c,false);
  _Var5 = verify_level((chunk_conflict *)c);
  if (!_Var5) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *desert_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	bool made_plat;

	struct loc grid;
	int j, d = 0;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int form_grids_target = p->depth * 20;

	int form_feats[] = { FEAT_GRASS, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_DUNE, FEAT_QUARTZ, FEAT_NONE };
	struct loc stair = loc(0, 0);

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass so paths work */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* Angband! */
		for (d = 0; d < c->width; d++) {
			for (grid.y = 0; grid.y < d; grid.y++) {
				grid.x = d - grid.y;
				if (!square_in_bounds_fully(c, grid))
					continue;
				if (square_feat(c, grid)->fidx == FEAT_ROAD) {
					/* The gate of Angband */
					square_set_feat(c, grid, FEAT_MORE);
					stair = grid;
					if (level_topography(last_place) == TOP_CAVE || turn < 10)
						player_place(c, p, grid);
					break;
				} else {
					/* The walls of Thangorodrim */
					square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			if (stair.y)
				break;
		}

		/* Adjust formation grids for how much of the level is removed */
		form_grids_target *= (c->width * c->height - (d * d / 2));
		form_grids_target /= (c->width * c->height);
	}

	/* Now place rubble, sand and magma */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create desert */
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				if (one_in_(2))
					square_set_feat(c, grid, FEAT_DUNE);
				else if (one_in_(2))
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(c, grid, FEAT_MAGMA);
			} else
				/* Prepare for clearings */
				square_mark(c, grid);
		}
	}

	/* Make a few clearings */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, xlo, xhi, y, ylo, yhi;

		/*
		 * Try for a clearing.  Constrain the center choice so the
		 * bounding box is in bounds and the center won't be within
		 * the maximum possible extent of the walls created by
		 * make_edges() (that's to avoid a room that's entirely
		 * surrounded by those walls).
		 */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		ylo = MAX(b, 7);
		yhi = MIN(c->height - 1 - b, c->height - 8);
		y = rand_range(ylo, yhi);
		xlo = MAX(a, 10);
		xhi = MIN(c->width - 1 - a, c->height - 11);
		x = rand_range(xlo, xhi);
		if (square_isgranite(c, loc(x, y))) continue;
		if (distance(loc(x, y), stair) < a + b) continue;
		made_plat = generate_starburst_room(c, y - b, x - a, y + b, x + a,
											false, FEAT_GRASS, false);

		/* Success ? */
		if (made_plat)
			plats--;

		/* Done ? */
		if (!plats)
			break;
	}

	/* Place some formations */
	while (form_grids < form_grids_target) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_RUBBLE, FEAT_MAGMA,
									 form_feats, "Desert", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}